

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O1

void __thiscall
anaPlanner::UpdateSuccs(anaPlanner *this,anaState *state,anaSearchStateSpace_t *pSearchStateSpace)

{
  DiscreteSpaceInformation *pDVar1;
  vector<int,_std::allocator<int>_> SuccIDV;
  vector<int,_std::allocator<int>_> CostV;
  
  pDVar1 = (this->super_SBPLPlanner).environment_;
  (*pDVar1->_vptr_DiscreteSpaceInformation[5])(pDVar1,(ulong)**(uint **)(state + 0x18));
  return;
}

Assistant:

void anaPlanner::UpdateSuccs(anaState* state, anaSearchStateSpace_t* pSearchStateSpace)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    CKey key;
    anaState *n;

    environment_->GetSuccs(state->MDPstate->StateID, &SuccIDV, &CostV);

    //iterate through predecessors of s
    for (int sind = 0; sind < (int)SuccIDV.size(); sind++) {
        CMDPSTATE* SuccMDPState = GetState(SuccIDV[sind], pSearchStateSpace);
        int cost = CostV[sind];

        n = (anaState*)(SuccMDPState->PlannerSpecificData);
        if (n->callnumberaccessed != pSearchStateSpace->callnumber) ReInitializeSearchStateInfo(n, pSearchStateSpace);

        //see if we can improve the value of n
        //taking into account the cost of action
        if ((n->g > state->g + cost) && ((state->g + cost + n->h) < pSearchStateSpace->G)) {
            n->g = state->g + cost;
            n->bestpredstate = state->MDPstate;

            key.key[0] = (long)-get_e_value(pSearchStateSpace, n->MDPstate->StateID);
            /*if(key.key[0] >= -1) {
             printf("inserting on Open with key =%d\n", key.key[0]);
             }*/
            if (pSearchStateSpace->heap->inheap(n)) {
                pSearchStateSpace->heap->updateheap(n, key);
            }
            else {
                pSearchStateSpace->heap->insertheap(n, key);
            }
        }
    }
}